

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O0

void __thiscall QStatusBar::hideOrShow(QStatusBar *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QStatusBarPrivate *pQVar4;
  const_iterator o;
  ulong uVar5;
  QRect *in_RDI;
  long in_FS_OFFSET;
  SBItem *item;
  add_const_t<QList<QStatusBarPrivate::SBItem>_> *__range1;
  bool haveMessage;
  QStatusBarPrivate *d;
  const_iterator __end1;
  const_iterator __begin1;
  QAccessibleEvent event;
  QString *in_stack_ffffffffffffff78;
  QWidget *in_stack_ffffffffffffff88;
  QWidget *this_00;
  const_iterator this_01;
  const_iterator local_30;
  undefined1 *local_28;
  undefined8 in_stack_ffffffffffffffe0;
  QWidget *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QStatusBar *)0x6a4080);
  bVar2 = QString::isEmpty((QString *)0x6a4096);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  this_00 = (QWidget *)&pQVar4->items;
  local_30.i = (SBItem *)&DAT_aaaaaaaaaaaaaaaa;
  local_30 = QList<QStatusBarPrivate::SBItem>::begin((QList<QStatusBarPrivate::SBItem> *)in_RDI);
  o = QList<QStatusBarPrivate::SBItem>::end((QList<QStatusBarPrivate::SBItem> *)in_RDI);
  while (this_01 = o,
        bVar2 = QList<QStatusBarPrivate::SBItem>::const_iterator::operator!=(&local_30,o), bVar2) {
    in_stack_ffffffffffffff88 =
         (QWidget *)QList<QStatusBarPrivate::SBItem>::const_iterator::operator*(&local_30);
    bVar2 = QStatusBarPrivate::SBItem::isPermanent((SBItem *)in_stack_ffffffffffffff88);
    if (bVar2) break;
    if ((bVar3 == 0) || (bVar2 = QWidget::isVisible((QWidget *)0x6a4159), !bVar2)) {
      if ((bVar3 == 0) &&
         (bVar2 = QWidget::testAttribute
                            (in_stack_ffffffffffffff88,(WidgetAttribute)((ulong)in_RDI >> 0x20)),
         !bVar2)) {
        QWidget::show(this_00);
      }
    }
    else {
      QWidget::hide((QWidget *)0x6a416c);
      QWidget::setAttribute
                (in_stack_ffffffffffffffe8,
                 (WidgetAttribute)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                 SUB81((ulong)in_stack_ffffffffffffffe0 >> 0x18,0));
    }
    QList<QStatusBarPrivate::SBItem>::const_iterator::operator++(&local_30);
  }
  messageChanged((QStatusBar *)in_RDI,in_stack_ffffffffffffff78);
  uVar5 = QAccessible::isActive();
  if ((uVar5 & 1) != 0) {
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,(QObject *)in_RDI,NameChanged);
    QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  }
  QStatusBarPrivate::messageRect((QStatusBarPrivate *)this_01.i);
  QWidget::update(in_stack_ffffffffffffff88,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStatusBar::hideOrShow()
{
    Q_D(QStatusBar);
    bool haveMessage = !d->tempItem.isEmpty();

    for (const auto &item : std::as_const(d->items)) {
        if (item.isPermanent())
            break;
        if (haveMessage && item.widget->isVisible()) {
            item.widget->hide();
            item.widget->setAttribute(Qt::WA_WState_ExplicitShowHide, false);
        } else if (!haveMessage && !item.widget->testAttribute(Qt::WA_WState_ExplicitShowHide)) {
            item.widget->show();
        }
    }

    emit messageChanged(d->tempItem);

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleEvent event(this, QAccessible::NameChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif

    update(d->messageRect());
}